

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn.c
# Opt level: O2

void Dau_FunctionEnum(int nInputs,int nVars,int nNodeMax,int fUseTwo,int fReduce,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime clk;
  Abc_TtHieMan_t *p;
  Vec_Mem_t *p_00;
  Vec_Int_t *p_01;
  word *pwVar5;
  ulong *puVar6;
  word wVar7;
  word wVar8;
  ulong *puVar9;
  word wVar10;
  word wVar11;
  abctime aVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  bool bVar16;
  abctime time;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  ulong *puVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  word *pwVar25;
  long lVar26;
  bool bVar27;
  bool bVar28;
  word tCur;
  ulong local_160 [4];
  int local_140;
  int local_13c;
  ulong *local_138;
  int local_130;
  uint local_12c;
  word local_128;
  ulong *local_120;
  word *local_118;
  int local_110;
  int local_10c;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  ulong *local_f0;
  word tCur_1;
  Vec_Mem_t *vTtMem;
  word Truth [4];
  int Limit [32];
  
  local_110 = fUseTwo;
  local_10c = fReduce;
  clk = Abc_Clock();
  local_140 = 1;
  iVar24 = 1 << ((char)nInputs - 6U & 0x1f);
  if (nInputs < 7) {
    iVar24 = local_140;
  }
  p = Abc_TtHieManStart(nInputs,5);
  p_00 = Vec_MemAlloc(iVar24,0x10);
  vTtMem = p_00;
  p_01 = Vec_IntAlloc(0x10000);
  Limit[2] = 0;
  Limit[3] = 0;
  Limit[0x1c] = 0;
  Limit[0x1d] = 0;
  Limit[0x1e] = 0;
  Limit[0x1f] = 0;
  Limit[0x18] = 0;
  Limit[0x19] = 0;
  Limit[0x1a] = 0;
  Limit[0x1b] = 0;
  Limit[0x14] = 0;
  Limit[0x15] = 0;
  Limit[0x16] = 0;
  Limit[0x17] = 0;
  Limit[0x10] = 0;
  Limit[0x11] = 0;
  Limit[0x12] = 0;
  Limit[0x13] = 0;
  Limit[0xc] = 0;
  Limit[0xd] = 0;
  Limit[0xe] = 0;
  Limit[0xf] = 0;
  Limit[8] = 0;
  Limit[9] = 0;
  Limit[10] = 0;
  Limit[0xb] = 0;
  Limit[4] = 0;
  Limit[5] = 0;
  Limit[6] = 0;
  Limit[7] = 0;
  Limit[0] = 1;
  Limit[1] = 2;
  Truth[2] = 0;
  Truth[3] = 0;
  Truth[0] = 0;
  Truth[1] = 0;
  if (((6 < nInputs) || (nInputs < nVars)) || (nVars < 3)) {
    __assert_fail("nVars >= 3 && nVars <= nInputs && nInputs <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                  ,0x277,"void Dau_FunctionEnum(int, int, int, int, int, int)");
  }
  Vec_MemHashAlloc(p_00,0x10000);
  Vec_MemHashInsert(p_00,Truth);
  Vec_IntPush(p_01,0);
  Truth[0] = 0x5555555555555555;
  Vec_MemHashInsert(p_00,Truth);
  Vec_IntPush(p_01,1);
  Dau_PrintStats(0,nInputs,nVars,p_01,0,2,0,0,clk);
  local_108 = (ulong)(uint)nNodeMax;
  local_128 = 0;
  if (nNodeMax < 1) {
    nNodeMax = 0;
  }
  local_100 = (ulong)(nNodeMax + 1);
  uVar13 = 1;
  do {
    if (uVar13 == local_100) {
      iVar24 = p_01->nSize;
      break;
    }
    bVar27 = local_10c == 0;
    bVar28 = uVar13 != local_108;
    bVar16 = bVar28 || bVar27;
    local_f8 = uVar13 - 1;
    local_130 = Limit[uVar13];
    for (iVar24 = local_140; iVar4 = (int)uVar13, iVar24 < local_130; iVar24 = iVar24 + 1) {
      pwVar5 = Vec_MemReadEntry(p_00,iVar24);
      uVar1 = Vec_IntEntry(p_01,iVar24);
      uVar20 = uVar1 & 0xf;
      local_12c = Dau_CountSymms2(*pwVar5,uVar20);
      if (local_f8 != (uint)((int)uVar1 >> 0x10)) {
        __assert_fail("n-1 == (NodSup >> 16)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                      ,0x28d,"void Dau_FunctionEnum(int, int, int, int, int, int)");
      }
      iVar2 = Abc_Tt6HasVar(*pwVar5,uVar20);
      if (iVar2 != 0) {
        __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                      ,0x28e,"void Dau_FunctionEnum(int, int, int, int, int, int)");
      }
      puVar6 = (ulong *)(ulong)uVar20;
      local_13c = uVar20 + 1;
      local_118 = pwVar5;
      for (puVar17 = (ulong *)0x0; puVar17 != puVar6; puVar17 = (ulong *)((long)puVar17 + 1)) {
        uVar1 = (uint)puVar17;
        if ((local_12c >> (uVar1 & 0x1f) & 1) == 0) {
          wVar7 = Abc_Tt6Cofactor0(*pwVar5,uVar1);
          wVar8 = Abc_Tt6Cofactor1(*pwVar5,uVar1);
          local_120 = puVar17;
          if ((int)uVar20 < nInputs && bVar16) {
            uVar23 = s_Truths6[(long)puVar17];
            uVar14 = s_Truths6[(long)puVar6];
            uVar19 = uVar14 & uVar23;
            tCur = wVar7 & ~uVar19 | uVar19 & wVar8;
            Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,local_13c,p_00,p_01,iVar24,clk);
            pwVar5 = local_118;
            tCur = ~uVar19 & wVar8 | uVar19 & wVar7;
            Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,local_13c,p_00,p_01,iVar24,clk);
            tCur = (wVar8 ^ wVar7) & (uVar14 ^ uVar23) ^ wVar7;
            Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,local_13c,p_00,p_01,iVar24,clk);
            local_128 = local_128 + 3;
          }
          puVar17 = local_120;
          if (bVar28 || bVar27) {
            puVar15 = (ulong *)((long)local_120 + 1);
            pwVar25 = s_Truths6;
            local_f0 = puVar15;
            for (puVar21 = (ulong *)0x0; pwVar5 = local_118, puVar6 != puVar21;
                puVar21 = (ulong *)((long)puVar21 + 1)) {
              if ((puVar17 != puVar21) &&
                 (puVar15 == puVar21 || (local_12c >> ((uint)puVar21 & 0x1f) & 1) == 0)) {
                uVar23 = s_Truths6[(long)puVar17];
                uVar14 = *pwVar25;
                uVar19 = uVar14 & uVar23;
                tCur = wVar7 & ~uVar19 | uVar19 & wVar8;
                local_138 = pwVar25;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                tCur = ~uVar19 & wVar8 | uVar19 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                uVar19 = ~uVar14 & uVar23;
                tCur = wVar7 & ~uVar19 | uVar19 & wVar8;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                tCur = ~uVar19 & wVar8 | uVar19 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                puVar17 = local_120;
                tCur = (wVar8 ^ wVar7) & (uVar14 ^ uVar23) ^ wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                local_128 = local_128 + 5;
                puVar15 = local_f0;
                pwVar25 = local_138;
              }
              pwVar25 = pwVar25 + 1;
            }
          }
          for (puVar15 = (ulong *)0x0; puVar15 != puVar6; puVar15 = (ulong *)((long)puVar15 + 1)) {
            puVar21 = puVar15;
            if (puVar15 != puVar17) {
              do {
                puVar9 = s_Truths6 + (long)puVar21;
                do {
                  puVar21 = (ulong *)((long)puVar21 + 1);
                  pwVar5 = local_118;
                  if (puVar6 <= puVar21) goto LAB_0043c2ac;
                  puVar9 = puVar9 + 1;
                } while (puVar17 == puVar21);
                uVar23 = *puVar9;
                uVar14 = s_Truths6[(long)puVar15];
                uVar19 = uVar14 & uVar23;
                tCur = wVar7 & ~uVar19 | uVar19 & wVar8;
                local_138 = puVar15;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                tCur = ~uVar19 & wVar8 | uVar19 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                uVar19 = ~uVar14 & uVar23;
                tCur = wVar7 & ~uVar19 | uVar19 & wVar8;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                tCur = ~uVar19 & wVar8 | uVar19 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                uVar19 = ~uVar23 & uVar14;
                tCur = wVar7 & ~uVar19 | uVar19 & wVar8;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                tCur = ~uVar19 & wVar8 | uVar19 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                uVar19 = uVar14 | uVar23;
                tCur = uVar19 & wVar7 | wVar8 & ~uVar19;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                tCur = uVar19 & wVar8 | ~uVar19 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                uVar14 = uVar14 ^ uVar23;
                tCur = wVar7 & ~uVar14 | uVar14 & wVar8;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                puVar17 = local_120;
                tCur = ~uVar14 & wVar8 | uVar14 & wVar7;
                Dau_InsertFunction(p,&tCur,iVar4,nInputs,nVars,uVar20,p_00,p_01,iVar24,clk);
                local_128 = local_128 + 10;
                puVar15 = local_138;
              } while( true );
            }
LAB_0043c2ac:
          }
        }
      }
    }
    iVar2 = 0;
    if ((2 < uVar13 && local_110 != 0) && bVar16) {
      local_138 = (ulong *)(uVar13 - 2);
      iVar2 = 0;
      for (iVar24 = Limit[uVar13 - 2]; iVar24 < local_140; iVar24 = iVar24 + 1) {
        pwVar5 = Vec_MemReadEntry(p_00,iVar24);
        uVar1 = Vec_IntEntry(p_01,iVar24);
        if ((int)uVar1 >> 0x10 != (int)local_138) {
          __assert_fail("n-2 == (NodSup >> 16)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                        ,0x2f4,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        uVar20 = uVar1 & 0xf;
        iVar3 = Abc_Tt6HasVar(*pwVar5,uVar20);
        if (iVar3 != 0) {
          __assert_fail("!Abc_Tt6HasVar(*pTruth, nSupp)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauNpn.c"
                        ,0x2f5,"void Dau_FunctionEnum(int, int, int, int, int, int)");
        }
        for (uVar23 = 0; uVar23 != uVar20; uVar23 = uVar23 + 1) {
          for (uVar14 = 0; uVar14 != uVar20; uVar14 = uVar14 + 1) {
            if (uVar14 != uVar23) {
              wVar7 = Abc_Tt6Cofactor0(*pwVar5,(int)uVar23);
              wVar8 = Abc_Tt6Cofactor1(*pwVar5,(int)uVar23);
              iVar3 = (int)uVar14;
              wVar10 = Abc_Tt6Cofactor0(wVar7,iVar3);
              wVar7 = Abc_Tt6Cofactor1(wVar7,iVar3);
              wVar11 = Abc_Tt6Cofactor0(wVar8,iVar3);
              wVar8 = Abc_Tt6Cofactor1(wVar8,iVar3);
              uVar19 = s_Truths6[uVar23];
              uVar18 = s_Truths6[uVar14];
              tCur = uVar18 & uVar19;
              local_160[0] = ~uVar18 & uVar19;
              local_160[1] = ~uVar19 & uVar18;
              local_160[2] = uVar18 | uVar19;
              local_160[3] = uVar18 ^ uVar19;
              for (lVar22 = 0; lVar26 = lVar22, lVar22 != 5; lVar22 = lVar22 + 1) {
                for (; lVar26 != 4; lVar26 = lVar26 + 1) {
                  uVar19 = local_160[lVar22 + -1];
                  uVar18 = wVar10 & ~uVar19 | uVar19 & wVar7;
                  tCur_1 = ((~uVar19 & wVar11 | uVar19 & wVar8) ^ uVar18) & local_160[lVar26] ^
                           uVar18;
                  iVar3 = Dau_InsertFunction(p,&tCur_1,iVar4,nInputs,nVars,uVar1 & 0xf,p_00,p_01,
                                             iVar24,clk);
                  iVar2 = iVar2 + iVar3;
                }
              }
            }
          }
        }
      }
    }
    iVar3 = local_130;
    iVar24 = p_01->nSize;
    Limit[uVar13 + 1] = iVar24;
    iVar4 = Dau_PrintStats(iVar4,nInputs,nVars,p_01,local_130,iVar24,local_128,iVar2,clk);
    local_140 = iVar3;
    uVar13 = uVar13 + 1;
  } while (iVar4 != 0);
  Dau_TablesSave(nInputs,nVars,p_00,p_01,iVar24,clk);
  aVar12 = Abc_Clock();
  Abc_PrintTime(0x79ec86,(char *)(aVar12 - clk),time);
  Abc_TtHieManStop(p);
  Vec_MemHashFree(p_00);
  Vec_MemFreeP(&vTtMem);
  Vec_IntFree(p_01);
  fflush(_stdout);
  return;
}

Assistant:

void Dau_FunctionEnum( int nInputs, int nVars, int nNodeMax, int fUseTwo, int fReduce, int fVerbose )
{
    abctime clk = Abc_Clock();
    int nWords = Abc_TtWordNum(nInputs); word nSteps = 0;
    Abc_TtHieMan_t * pMan = Abc_TtHieManStart( nInputs, 5 );
    Vec_Mem_t * vTtMem  = Vec_MemAlloc( nWords, 16 );
    Vec_Int_t * vNodSup = Vec_IntAlloc( 1 << 16 );
    int v, u, k, m, n, Entry, nNew, Limit[32] = {1, 2};
    word Truth[4] = {0};
    assert( nVars >= 3 && nVars <= nInputs && nInputs <= 6 );
    Vec_MemHashAlloc( vTtMem,  1<<16 );
    // add constant 0
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 0 ); // nodes=0, supp=0
    // add buffer/inverter
    Abc_TtIthVar( Truth, 0, nInputs );
    Abc_TtNot( Truth, nWords );
    Vec_MemHashInsert( vTtMem,  Truth );
    Vec_IntPush( vNodSup, 1 ); // nodes=0, supp=1
    Dau_PrintStats( 0, nInputs, nVars, vNodSup, 0, 2, nSteps, 0, clk );
    // numerate other functions based on how many nodes they have
    for ( n = 1; n <= nNodeMax; n++ )
    {
        int Count2 = 0;
        int fExpand = !(fReduce && n == nNodeMax);
        for ( Entry = Limit[n-1]; Entry < Limit[n]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup;
            int SymVars = Dau_CountSymms2( pTruth[0], nSupp );
            assert( n-1 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            //printf( "Exploring function %4d with %d vars: ", i, nSupp );
            //printf( " %04x\n", (int)uTruth );
            //Dau_DsdPrintFromTruth( &uTruth, 4 );
            for ( v = 0; v < nSupp; v++ ) if ( (SymVars & (1 << v)) == 0 )
            {
                word tGate, tCur;
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );
                // add one extra variable to support
                if ( nSupp < nInputs && fExpand )
                {
                    tGate = s_Truths6[v] & s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[nSupp];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp+1, vTtMem, vNodSup, Entry, clk );

                    nSteps += 3;
                }
                // add one cross bar
                if ( fExpand )
                for ( k = 0; k < nSupp; k++ ) if ( k != v && ((SymVars & (1 << k)) == 0 || k == v+1) )
                {
                    tGate = s_Truths6[v] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[v] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );


                    tGate = s_Truths6[v] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 5;
                }
                // add two cross bars
                for ( k = 0;   k < nSupp; k++ ) if ( k != v )//&& ((SymVars & (1 << k)) == 0) )
                for ( m = k+1; m < nSupp; m++ ) if ( m != v )//&& ((SymVars & (1 << m)) == 0 || m == k+1) )
                {
                    tGate = s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = ~s_Truths6[m] & ~s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    
                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof1) | (~tGate & Cof0);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    tGate = s_Truths6[m] ^ s_Truths6[k];
                    tCur  = (tGate & Cof0) | (~tGate & Cof1);
                    Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );

                    nSteps += 10;
                }
            }
        } 
        if ( fUseTwo && n > 2 && fExpand )
        for ( Entry = Limit[n-2]; Entry < Limit[n-1]; Entry++ )
        {
            word * pTruth = Vec_MemReadEntry( vTtMem, Entry );
            int NodSup = Vec_IntEntry(vNodSup, Entry);
            int nSupp = 0xF & NodSup; int g1, g2;
            assert( n-2 == (NodSup >> 16) );
            assert( !Abc_Tt6HasVar(*pTruth, nSupp) );
            for ( v = 0; v < nSupp; v++ )
            for ( u = 0; u < nSupp; u++ ) if ( u != v )
            {
                word Cof0 = Abc_Tt6Cofactor0( *pTruth, v );
                word Cof1 = Abc_Tt6Cofactor1( *pTruth, v );

                word Cof00 = Abc_Tt6Cofactor0( Cof0, u );
                word Cof01 = Abc_Tt6Cofactor1( Cof0, u );
                word Cof10 = Abc_Tt6Cofactor0( Cof1, u );
                word Cof11 = Abc_Tt6Cofactor1( Cof1, u );

                word tGates[5], tCur;
                tGates[0] =  s_Truths6[v] &  s_Truths6[u];
                tGates[1] =  s_Truths6[v] & ~s_Truths6[u];
                tGates[2] = ~s_Truths6[v] &  s_Truths6[u];
                tGates[3] =  s_Truths6[v] |  s_Truths6[u];
                tGates[4] =  s_Truths6[v] ^  s_Truths6[u];

                for ( g1 = 0;    g1 < 5; g1++ )
                for ( g2 = g1+1; g2 < 5; g2++ )
                {
                    Cof0  = (tGates[g1] & Cof01) | (~tGates[g1] & Cof00);
                    Cof1  = (tGates[g1] & Cof11) | (~tGates[g1] & Cof10);

                    tCur  = (tGates[g2] & Cof1)  | (~tGates[g2] & Cof0);
                    Count2 += Dau_InsertFunction( pMan, &tCur, n, nInputs, nVars, nSupp, vTtMem, vNodSup, Entry, clk );
                }
            }
        }
        Limit[n+1] = Vec_IntSize(vNodSup);
        nNew = Dau_PrintStats( n, nInputs, nVars, vNodSup, Limit[n], Limit[n+1], nSteps, Count2, clk );
        if ( nNew == 0 )
            break;
    }
    Dau_TablesSave( nInputs, nVars, vTtMem, vNodSup, Vec_IntSize(vNodSup), clk );
    Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    //Dau_DumpFuncs( vTtMem, vNodSup, nVars, nNodeMax );
    //Dau_ExactNpnPrint( vTtMem, vNodSup, nVars, nInputs, n );
    Abc_TtHieManStop( pMan );
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    Vec_IntFree( vNodSup );
    fflush(stdout);
}